

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AppendStorageScanners
               (cmGeneratedFileStream *fout,cmMakefile *makefile)

{
  char *pcVar1;
  allocator local_12c;
  allocator local_12b;
  allocator local_12a;
  allocator local_129;
  string compilerArgs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string arg1;
  string compiler;
  string local_a8;
  string local_88;
  string local_68;
  string make;
  
  std::__cxx11::string::string((string *)&compiler,"CMAKE_MAKE_PROGRAM",(allocator *)&arg1);
  pcVar1 = cmMakefile::GetRequiredDefinition(makefile,&compiler);
  std::__cxx11::string::string((string *)&make,pcVar1,(allocator *)&compilerArgs);
  std::__cxx11::string::~string((string *)&compiler);
  std::__cxx11::string::string((string *)&arg1,"CMAKE_C_COMPILER",(allocator *)&compilerArgs);
  pcVar1 = cmMakefile::GetSafeDefinition(makefile,&arg1);
  std::__cxx11::string::string((string *)&compiler,pcVar1,(allocator *)&local_108);
  std::__cxx11::string::~string((string *)&arg1);
  std::__cxx11::string::string
            ((string *)&compilerArgs,"CMAKE_C_COMPILER_ARG1",(allocator *)&local_108);
  pcVar1 = cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
  std::__cxx11::string::string((string *)&arg1,pcVar1,(allocator *)&local_a8);
  std::__cxx11::string::~string((string *)&compilerArgs);
  if (compiler._M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)&compilerArgs,"CMAKE_CXX_COMPILER",(allocator *)&local_108);
    cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
    std::__cxx11::string::assign((char *)&compiler);
    std::__cxx11::string::~string((string *)&compilerArgs);
    std::__cxx11::string::string
              ((string *)&compilerArgs,"CMAKE_CXX_COMPILER_ARG1",(allocator *)&local_108);
    cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
    std::__cxx11::string::assign((char *)&arg1);
    std::__cxx11::string::~string((string *)&compilerArgs);
    if (compiler._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&compiler);
    }
  }
  std::__cxx11::string::string
            ((string *)&compilerArgs,"-E -P -v -dD ${plugin_state_location}/${specs_file}",
             (allocator *)&local_108);
  if (arg1._M_string_length != 0) {
    std::__cxx11::string::append((char *)&arg1);
    std::operator+(&local_108,&arg1,&compilerArgs);
    std::__cxx11::string::operator=((string *)&compilerArgs,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::operator<<((ostream *)fout,
                  "<storageModule moduleId=\"scannerConfiguration\">\n<autodiscovery enabled=\"true\" problemReportingEnabled=\"true\" selectedProfileId=\"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile\"/>\n"
                 );
  std::__cxx11::string::string
            ((string *)&local_108,"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile",
             (allocator *)&local_68);
  std::__cxx11::string::string((string *)&local_a8,"",&local_12b);
  std::__cxx11::string::string((string *)&local_88,"specsFile",&local_12c);
  AppendScannerProfile
            (fout,&local_108,true,&local_a8,true,&local_88,&compilerArgs,&compiler,true,true);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string
            ((string *)&local_108,"org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile",
             &local_12b);
  std::__cxx11::string::string((string *)&local_a8,"",&local_12c);
  std::__cxx11::string::string((string *)&local_88,"makefileGenerator",&local_129);
  std::__cxx11::string::string((string *)&local_68,"-f ${project_name}_scd.mk",&local_12a);
  AppendScannerProfile(fout,&local_108,true,&local_a8,true,&local_88,&local_68,&make,true,true);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_108);
  std::operator<<((ostream *)fout,"</storageModule>\n");
  std::__cxx11::string::~string((string *)&compilerArgs);
  std::__cxx11::string::~string((string *)&arg1);
  std::__cxx11::string::~string((string *)&compiler);
  std::__cxx11::string::~string((string *)&make);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator
::AppendStorageScanners(cmGeneratedFileStream& fout,
                        const cmMakefile& makefile)
{
  // we need the "make" and the C (or C++) compiler which are used, Alex
  std::string make = makefile.GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = makefile.GetSafeDefinition("CMAKE_C_COMPILER");
  std::string arg1 = makefile.GetSafeDefinition("CMAKE_C_COMPILER_ARG1");
  if (compiler.empty())
    {
    compiler = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER");
    arg1 = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER_ARG1");
    }
  if (compiler.empty())  //Hmm, what to do now ?
    {
    compiler = "gcc";
    }

  // the following right now hardcodes gcc behaviour :-/
  std::string compilerArgs =
                         "-E -P -v -dD ${plugin_state_location}/${specs_file}";
  if (!arg1.empty())
    {
    arg1 += " ";
    compilerArgs = arg1 + compilerArgs;
    }

  fout <<
    "<storageModule moduleId=\"scannerConfiguration\">\n"
    "<autodiscovery enabled=\"true\" problemReportingEnabled=\"true\""
    " selectedProfileId="
    "\"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile\"/>\n"
    ;
  cmExtraEclipseCDT4Generator::AppendScannerProfile(fout,
    "org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile",
    true, "", true, "specsFile",
    compilerArgs,
    compiler, true, true);
  cmExtraEclipseCDT4Generator::AppendScannerProfile(fout,
    "org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile",
    true, "", true, "makefileGenerator",
    "-f ${project_name}_scd.mk",
    make, true, true);

  fout << "</storageModule>\n";
}